

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gzio.cc
# Opt level: O3

void __thiscall gzip_readwrite_Test::TestBody(gzip_readwrite_Test *this)

{
  byte *pbVar1;
  size_type sVar2;
  int32_t iVar3;
  uint uVar4;
  gzFile pgVar5;
  off64_t oVar6;
  char *pcVar7;
  char *in_R9;
  int64_t pos;
  uint32_t compr_len;
  int err;
  uint8_t uncompr [128];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  undefined8 *local_d8;
  string local_d0;
  AssertHelper local_b0;
  off64_t local_a8;
  uint local_a0;
  int local_9c;
  char local_98 [128];
  
  local_a0 = 0x80;
  pgVar5 = zng_gzopen("foo.gz","wb");
  local_e0._M_head_impl._0_1_ = pgVar5 != (gzFile)0x0;
  local_d8 = (undefined8 *)0x0;
  if (pgVar5 == (gzFile)0x0) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d0,(internal *)&local_e0,(AssertionResult *)"file != __null","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
               ,0x24,(char *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                      (char)local_d0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_e8);
  }
  else {
    zng_gzputc(pgVar5,0x68);
    iVar3 = zng_gzputs(pgVar5,"ello");
    local_e0._M_head_impl._0_4_ = iVar3;
    local_e8._M_head_impl._0_4_ = 4;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_d0,"zng_gzputs(file, \"ello\")","4",(int *)&local_e0,
               (int *)&local_e8);
    if ((char)local_d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_e0);
      if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                 ,0x27,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e0._M_head_impl + 8))();
      }
    }
    sVar2 = local_d0._M_string_length;
    if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_d0._M_string_length !=
          (undefined8 *)(local_d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_d0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    iVar3 = zng_gzprintf(pgVar5,", %s!","hello");
    local_e0._M_head_impl._0_4_ = iVar3;
    local_e8._M_head_impl._0_4_ = 8;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_d0,"zng_gzprintf(file, \", %s!\", \"hello\")","8",(int *)&local_e0
               ,(int *)&local_e8);
    if ((char)local_d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_e0);
      if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                 ,0x28,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e0._M_head_impl + 8))();
      }
    }
    sVar2 = local_d0._M_string_length;
    if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_d0._M_string_length !=
          (undefined8 *)(local_d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_d0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    local_e0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         zng_gzseek(pgVar5,1,1);
    local_e8._M_head_impl = local_e8._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperGE<long,int>
              ((internal *)&local_d0,"zng_gzseek(file, 1L, 1)","0",(long *)&local_e0,
               (int *)&local_e8);
    if ((char)local_d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_e0);
      if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                 ,0x2a,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e0._M_head_impl + 8))();
      }
    }
    sVar2 = local_d0._M_string_length;
    if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_d0._M_string_length !=
          (undefined8 *)(local_d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_d0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    iVar3 = zng_gzsetparams(pgVar5,9,0);
    local_e0._M_head_impl._0_4_ = iVar3;
    local_e8._M_head_impl = local_e8._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_d0,"zng_gzsetparams(file, 9, 0)","0",(int *)&local_e0,
               (int *)&local_e8);
    if ((char)local_d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_e0);
      if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                 ,0x2c,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e0._M_head_impl + 8))();
      }
    }
    sVar2 = local_d0._M_string_length;
    if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_d0._M_string_length !=
          (undefined8 *)(local_d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_d0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    local_e0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         zng_gzfwrite("hello, hello!",0xe,1,pgVar5);
    local_e8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
              ((internal *)&local_d0,"zng_gzfwrite(hello, hello_len, 1, file)","0UL",
               (unsigned_long *)&local_e0,(unsigned_long *)&local_e8);
    if ((char)local_d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_e0);
      if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                 ,0x2d,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e0._M_head_impl + 8))();
      }
    }
    sVar2 = local_d0._M_string_length;
    if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_d0._M_string_length !=
          (undefined8 *)(local_d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_d0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    iVar3 = zng_gzflush(pgVar5,2);
    local_e0._M_head_impl._0_4_ = iVar3;
    local_e8._M_head_impl = local_e8._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_d0,"zng_gzflush(file, 2)","0",(int *)&local_e0,(int *)&local_e8);
    if ((char)local_d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_e0);
      if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                 ,0x2f,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e0._M_head_impl + 8))();
      }
    }
    sVar2 = local_d0._M_string_length;
    if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_d0._M_string_length !=
          (undefined8 *)(local_d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_d0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    oVar6 = zng_gzoffset(pgVar5);
    local_a0 = (uint)oVar6;
    local_e0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperGE<unsigned_int,unsigned_long>
              ((internal *)&local_d0,"compr_len","0UL",&local_a0,(unsigned_long *)&local_e0);
    if ((char)local_d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_e0);
      if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                 ,0x31,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e0._M_head_impl + 8))();
      }
    }
    sVar2 = local_d0._M_string_length;
    if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_d0._M_string_length !=
          (undefined8 *)(local_d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_d0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    zng_gzclose(pgVar5);
    pgVar5 = zng_gzopen("foo.gz","rb");
    local_e0._M_head_impl._0_1_ = pgVar5 != (gzFile)0x0;
    local_d8 = (undefined8 *)0x0;
    if (pgVar5 != (gzFile)0x0) {
      builtin_strncpy(local_98,"garbages",9);
      iVar3 = zng_gzread(pgVar5,local_98,0x80);
      local_e0._M_head_impl._0_4_ = iVar3;
      local_e8._M_head_impl._0_4_ = 0x1c;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_d0,"zng_gzread(file, uncompr, (unsigned)uncompr_len)",
                 "(int)(hello_len + hello_len)",(int *)&local_e0,(int *)&local_e8);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x3a,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_d0,"(char*)uncompr","hello",local_98,"hello, hello!");
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x3b,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      iVar3 = zng_gzeof(pgVar5);
      local_e0._M_head_impl._0_4_ = iVar3;
      local_e8._M_head_impl._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_d0,"zng_gzeof(file)","1",(int *)&local_e0,(int *)&local_e8);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x3e,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      local_a8 = zng_gzseek(pgVar5,-0x16,1);
      local_e0._M_head_impl._0_4_ = 6;
      testing::internal::CmpHelperEQ<long,int>
                ((internal *)&local_d0,"pos","6",&local_a8,(int *)&local_e0);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x42,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      local_e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           zng_gztell(pgVar5);
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&local_d0,"zng_gztell(file)","pos",(long *)&local_e0,&local_a8);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x43,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      if (pgVar5->have == 0) {
        uVar4 = zng_gzgetc(pgVar5);
      }
      else {
        pgVar5->have = pgVar5->have - 1;
        pgVar5->pos = pgVar5->pos + 1;
        pbVar1 = pgVar5->next;
        pgVar5->next = pbVar1 + 1;
        uVar4 = (uint)*pbVar1;
      }
      local_e0._M_head_impl._0_4_ = uVar4;
      local_e8._M_head_impl._0_1_ = 0x20;
      testing::internal::CmpHelperEQ<int,char>
                ((internal *)&local_d0,
                 "((file)->have ? ((file)->have--, (file)->pos++, *((file)->next)++) : (zng_gzgetc)(file))"
                 ,"\' \'",(int *)&local_e0,(char *)&local_e8);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x44,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      iVar3 = zng_gzungetc(0x20,pgVar5);
      local_e0._M_head_impl._0_4_ = iVar3;
      local_e8._M_head_impl._0_1_ = 0x20;
      testing::internal::CmpHelperEQ<int,char>
                ((internal *)&local_d0,"zng_gzungetc(\' \', file)","\' \'",(int *)&local_e0,
                 (char *)&local_e8);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x45,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      builtin_strncpy(local_98,"garbages",9);
      zng_gzgets(pgVar5,local_98,0x80);
      local_e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           strlen(local_98);
      local_e8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_d0,"strlen((char*)uncompr)","7UL",(unsigned_long *)&local_e0,
                 (unsigned_long *)&local_e8);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x49,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_d0,"(char*)uncompr","hello + 6",local_98," hello!");
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x4a,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      local_a8 = zng_gzseek(pgVar5,0xe,0);
      local_e0._M_head_impl._0_4_ = 0xe;
      testing::internal::CmpHelperEQ<long,int>
                ((internal *)&local_d0,"pos","14",&local_a8,(int *)&local_e0);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x4e,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      local_e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           zng_gztell(pgVar5);
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&local_d0,"zng_gztell(file)","pos",(long *)&local_e0,&local_a8);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x4f,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      iVar3 = zng_gzeof(pgVar5);
      local_e0._M_head_impl._0_4_ = iVar3;
      local_e8._M_head_impl = local_e8._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_d0,"zng_gzeof(file)","0",(int *)&local_e0,(int *)&local_e8);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x52,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      builtin_strncpy(local_98,"garbages",9);
      zng_gzfread(local_98,0x80,1,pgVar5);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_d0,"(const char *)uncompr","hello",local_98,"hello, hello!");
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x56,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      local_a8 = zng_gzoffset(pgVar5);
      local_e0._M_head_impl = local_e0._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperGE<long,int>
                ((internal *)&local_d0,"pos","0",&local_a8,(int *)&local_e0);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x59,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      local_e0._M_head_impl._0_4_ = local_a0 + 10;
      testing::internal::CmpHelperEQ<long,unsigned_int>
                ((internal *)&local_d0,"pos","(compr_len + 10)",&local_a8,(uint *)&local_e0);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x5a,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      zng_gzfread(local_98,0xffffffffffffffff,0xffffffffffffffff,pgVar5);
      zng_gzerror(pgVar5,&local_9c);
      local_e0._M_head_impl = local_e0._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperNE<int,int>
                ((internal *)&local_d0,"err","0",&local_9c,(int *)&local_e0);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x5f,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      zng_gzclearerr(pgVar5);
      zng_gzerror(pgVar5,&local_9c);
      local_e0._M_head_impl = local_e0._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_d0,"err","0",&local_9c,(int *)&local_e0);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,99,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      sVar2 = local_d0._M_string_length;
      if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_d0._M_string_length !=
            (undefined8 *)(local_d0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_d0._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      zng_gzclose(pgVar5);
      iVar3 = zng_gzclose((gzFile)0x0);
      local_e0._M_head_impl._0_4_ = iVar3;
      local_e8._M_head_impl._0_4_ = 0xfffffffe;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_d0,"zng_gzclose(__null)","(-2)",(int *)&local_e0,
                 (int *)&local_e8);
      if ((char)local_d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e0);
        if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
                   ,0x67,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
      }
      goto LAB_00126ffe;
    }
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d0,(internal *)&local_e0,(AssertionResult *)"file != __null","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_gzio.cc"
               ,0x36,(char *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                      (char)local_d0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_e8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) !=
      &local_d0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p));
  }
  local_d0._M_string_length = (size_type)local_d8;
  if (local_e8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_e8._M_head_impl + 8))();
    local_d0._M_string_length = (size_type)local_d8;
  }
LAB_00126ffe:
  if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_d0._M_string_length !=
        (undefined8 *)(local_d0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_d0._M_string_length);
    }
    operator_delete((void *)local_d0._M_string_length);
  }
  return;
}

Assistant:

TEST(gzip, readwrite) {
#ifdef NO_GZCOMPRESS
    fprintf(stderr, "NO_GZCOMPRESS -- gz* functions cannot compress\n");
    GTEST_SKIP();
#else
    uint8_t compr[128], uncompr[128];
    uint32_t compr_len = sizeof(compr), uncompr_len = sizeof(uncompr);
    size_t read;
    int64_t pos;
    gzFile file;
    int err;

    Z_UNUSED(compr);
    /* Write gz file with test data */
    file = PREFIX(gzopen)(TESTFILE, "wb");
    ASSERT_TRUE(file != NULL);
    /* Write hello, hello! using gzputs and gzprintf */
    PREFIX(gzputc)(file, 'h');
    EXPECT_EQ(PREFIX(gzputs)(file, "ello"), 4);
    EXPECT_EQ(PREFIX(gzprintf)(file, ", %s!", "hello"), 8);
    /* Write string null-teriminator using gzseek */
    EXPECT_GE(PREFIX(gzseek)(file, 1L, SEEK_CUR), 0);
    /* Write hello, hello! using gzfwrite using best compression level */
    EXPECT_EQ(PREFIX(gzsetparams)(file, Z_BEST_COMPRESSION, Z_DEFAULT_STRATEGY), Z_OK);
    EXPECT_NE(PREFIX(gzfwrite)(hello, hello_len, 1, file), 0UL);
    /* Flush compressed bytes to file */
    EXPECT_EQ(PREFIX(gzflush)(file, Z_SYNC_FLUSH), Z_OK);
    compr_len = (uint32_t)PREFIX(gzoffset)(file);
    EXPECT_GE(compr_len, 0UL);
    PREFIX(gzclose)(file);

    /* Open gz file we previously wrote */
    file = PREFIX(gzopen)(TESTFILE, "rb");
    ASSERT_TRUE(file != NULL);

    /* Read uncompressed data - hello, hello! string twice */
    strcpy((char*)uncompr, "garbages");
    EXPECT_EQ(PREFIX(gzread)(file, uncompr, (unsigned)uncompr_len), (int)(hello_len + hello_len));
    EXPECT_STREQ((char*)uncompr, hello);

    /* Check position at the end of the gz file */
    EXPECT_EQ(PREFIX(gzeof)(file), 1);

    /* Seek backwards mid-string and check char reading with gzgetc and gzungetc */
    pos = PREFIX(gzseek)(file, -22L, SEEK_CUR);
    EXPECT_EQ(pos, 6);
    EXPECT_EQ(PREFIX(gztell)(file), pos);
    EXPECT_EQ(PREFIX(gzgetc)(file), ' ');
    EXPECT_EQ(PREFIX(gzungetc)(' ', file), ' ');
    /* Read first hello, hello! string with gzgets */
    strcpy((char*)uncompr, "garbages");
    PREFIX(gzgets)(file, (char*)uncompr, (int)uncompr_len);
    EXPECT_EQ(strlen((char*)uncompr), 7UL); /* " hello!" */
    EXPECT_STREQ((char*)uncompr, hello + 6);

    /* Seek to second hello, hello! string */
    pos = PREFIX(gzseek)(file, 14L, SEEK_SET);
    EXPECT_EQ(pos, 14);
    EXPECT_EQ(PREFIX(gztell)(file), pos);

    /* Check position not at end of file */
    EXPECT_EQ(PREFIX(gzeof)(file), 0);
    /* Read first hello, hello! string with gzfread */
    strcpy((char*)uncompr, "garbages");
    read = PREFIX(gzfread)(uncompr, uncompr_len, 1, file);
    EXPECT_STREQ((const char *)uncompr, hello);

    pos = PREFIX(gzoffset)(file);
    EXPECT_GE(pos, 0);
    EXPECT_EQ(pos, (compr_len + 10));

    /* Trigger an error and clear it with gzclearerr */
    PREFIX(gzfread)(uncompr, (size_t)-1, (size_t)-1, file);
    PREFIX(gzerror)(file, &err);
    EXPECT_NE(err, 0);

    PREFIX(gzclearerr)(file);
    PREFIX(gzerror)(file, &err);
    EXPECT_EQ(err, 0);

    PREFIX(gzclose)(file);

    EXPECT_EQ(PREFIX(gzclose)(NULL), Z_STREAM_ERROR);
    Z_UNUSED(read);
#endif
}